

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QList<QDockWidget_*> * __thiscall
QMainWindowTabBar::dockWidgets(QList<QDockWidget_*> *__return_storage_ptr__,QMainWindowTabBar *this)

{
  int iVar1;
  int iVar2;
  QDockWidget *pQVar3;
  long in_FS_OFFSET;
  QDockWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QDockWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar1 = QTabBar::count((QTabBar *)this);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      pQVar3 = dockAt(this,iVar1);
      if (pQVar3 != (QDockWidget *)0x0) {
        local_30 = pQVar3;
        QtPrivate::QPodArrayOps<QDockWidget*>::emplace<QDockWidget*&>
                  ((QPodArrayOps<QDockWidget*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_30);
        QList<QDockWidget_*>::end(__return_storage_ptr__);
      }
      iVar1 = iVar1 + 1;
      iVar2 = QTabBar::count((QTabBar *)this);
    } while (iVar1 < iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QDockWidget *> QMainWindowTabBar::dockWidgets() const
{
    QList<QDockWidget *> docks;
    for (int i = 0; i < count(); ++i) {
        if (QDockWidget *dock = dockAt(i))
            docks << dock;
    }
    return docks;
}